

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corpus.c
# Opt level: O0

FILE * open_file_for_reading(uint32 type)

{
  char *__filename;
  FILE *pFVar1;
  FILE *out;
  char *fn;
  uint32 type_local;
  
  __filename = mk_filename(type,cur_ctl_path);
  pFVar1 = fopen(__filename,"r");
  if (pFVar1 == (FILE *)0x0) {
    err_msg_system(ERR_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/corpus.c"
                   ,0x4ea,"Unable to open %s for reading\n",__filename);
  }
  return (FILE *)pFVar1;
}

Assistant:

static FILE *
open_file_for_reading(uint32 type)
{
    char *fn;
    FILE *out;

    fn = mk_filename(type, cur_ctl_path);

    out = fopen(fn, "r");
    if (out == NULL) {
	E_ERROR_SYSTEM("Unable to open %s for reading\n", fn);
    }
    
    return out;
}